

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O3

void sarima_exec(sarima_object obj,double *inp)

{
  int *piVar1;
  int *theta;
  int q;
  int d;
  int N;
  int P;
  int Q;
  int D;
  int iVar2;
  int s;
  int iVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  
  iVar3 = obj->p;
  lVar8 = (long)iVar3;
  q = obj->q;
  lVar7 = (long)q;
  d = obj->d;
  lVar10 = (long)d;
  N = obj->N;
  lVar9 = (long)N;
  P = obj->P;
  lVar5 = (long)P;
  Q = obj->Q;
  lVar6 = (long)Q;
  D = obj->D;
  iVar2 = obj->method;
  s = obj->s;
  if (iVar2 == 2) {
    dVar11 = macheps();
    theta = &obj[1].N + lVar8 * 2;
    piVar1 = theta + lVar7 * 2;
    piVar4 = piVar1 + lVar5 * 2;
    iVar3 = nlalsms(inp,obj->N,obj->p,obj->d,obj->q,(double *)(obj + 1),(double *)theta,obj->s,
                    obj->P,obj->D,obj->Q,(double *)piVar1,(double *)piVar4,obj->M,&obj->mean,
                    &obj->var,dVar11,
                    (double *)(piVar4 + lVar6 * 2 + (lVar9 + (-lVar10 - (long)(s * D))) * 2),
                    (double *)(piVar4 + lVar6 * 2));
    obj->retval = iVar3;
  }
  else if (iVar2 == 1) {
    piVar4 = &obj[1].N + lVar8 * 2;
    piVar1 = piVar4 + lVar7 * 2;
    iVar3 = css_seas(inp,N,obj->optmethod,iVar3,d,q,s,P,D,Q,(double *)(obj + 1),(double *)piVar4,
                     (double *)piVar1,(double *)(piVar1 + lVar5 * 2),&obj->mean,&obj->var,
                     &obj->loglik,
                     (double *)
                     (piVar1 + lVar5 * 2 + (lVar6 + lVar9 + (-lVar10 - (long)(s * D))) * 2));
    obj->retval = iVar3;
    obj->loglik = (obj->loglik + obj->loglik + 1.0 + 1.8378762217451237) * (double)obj->Nused * -0.5
    ;
  }
  else if (iVar2 == 0) {
    piVar4 = &obj[1].N + lVar8 * 2;
    piVar1 = piVar4 + lVar7 * 2;
    iVar3 = as154_seas(inp,N,obj->optmethod,iVar3,d,q,s,P,D,Q,(double *)(obj + 1),(double *)piVar4,
                       (double *)piVar1,(double *)(piVar1 + lVar5 * 2),&obj->mean,&obj->var,
                       &obj->loglik,
                       (double *)
                       (piVar1 + lVar5 * 2 + (lVar6 + lVar9 + (-lVar10 - (long)(s * D))) * 2),
                       obj->cssml);
    obj->retval = iVar3;
    dVar12 = (obj->loglik + obj->loglik + 1.0 + 1.8378762217451237) * (double)obj->Nused * -0.5;
    obj->loglik = dVar12;
    dVar11 = (double)(obj->q + obj->p + obj->P + obj->Q + obj->M);
    obj->aic = ((dVar11 + dVar11) - (dVar12 + dVar12)) + 2.0;
  }
  return;
}

Assistant:

void sarima_exec(sarima_object obj, double *inp) {
	int p, q, d, s,P,D,Q,N, M,cssml,trparams;
	double eps;

	p = obj->p;
	q = obj->q;
	d = obj->d;
	N = obj->N;
	P = obj->P;
	Q = obj->Q;
	D = obj->D;
	s = obj->s;

	M = obj->M;

	if (obj->method == 0) {
		obj->retval = as154_seas(inp, obj->N, obj->optmethod, obj->p, obj->d, obj->q, obj->s, obj->P, obj->D, obj->Q, obj->params, obj->params + p, obj->params + p + q, 
			obj->params + p + q + P, &obj->mean, &obj->var, &obj->loglik, obj->params + p + q + P + Q + N - d - s*D,obj->cssml);
		obj->loglik = -0.5 * (obj->Nused * (2 * obj->loglik + 1.0 + log(2 * 3.14159)));
		obj->aic = -2.0 * obj->loglik + 2.0 * (obj->p + obj->q + obj->P + obj->Q + obj->M) + 2.0;
	}
	else if (obj->method == 1) {
		obj->retval = css_seas(inp, obj->N, obj->optmethod, obj->p, obj->d, obj->q, obj->s, obj->P, obj->D, obj->Q, obj->params, obj->params + p, obj->params + p + q,
			obj->params + p + q + P, &obj->mean, &obj->var, &obj->loglik, obj->params + p + q + P + Q + N - d - s*D);
		obj->loglik = -0.5 * (obj->Nused * (2 * obj->loglik + 1.0 + log(2 * 3.14159)));
	}
	else if (obj->method == 2) {
		eps = macheps();
		obj->retval = nlalsms(inp, obj->N, obj->p, obj->d, obj->q, obj->params, obj->params + p, obj->s, obj->P, obj->D, obj->Q, obj->params + p + q, obj->params + p + q + P, obj->M, &obj->mean, &obj->var, eps,
			obj->params + p + q + P + Q + N - d - s*D, obj->params + p + q + P + Q);
	}

}